

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoTableInit(Thread *this,Instr instr,Ptr *out_trap)

{
  Store *pSVar1;
  bool bVar2;
  RefVec *this_00;
  const_reference pvVar3;
  vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_> *this_01;
  Table *this_02;
  allocator<char> local_91;
  string local_90;
  Ptr local_70;
  Enum local_58;
  u32 local_54;
  uint local_50;
  uint dst;
  uint src;
  uint size;
  value_type *elem;
  undefined1 local_38 [8];
  Ptr table;
  Ptr *out_trap_local;
  Thread *this_local;
  
  pSVar1 = this->store_;
  table.root_index_ = (Index)out_trap;
  this_00 = Instance::tables(this->inst_);
  pvVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                     (this_00,(ulong)instr.field_2.imm_u32);
  elem = (value_type *)pvVar3->index;
  RefPtr<wabt::interp::Table>::RefPtr((RefPtr<wabt::interp::Table> *)local_38,pSVar1,(Ref)elem);
  this_01 = Instance::elems(this->inst_);
  _src = std::vector<wabt::interp::ElemSegment,_std::allocator<wabt::interp::ElemSegment>_>::
         operator[](this_01,(ulong)instr.field_2.imm_u32x2.snd);
  dst = Pop<unsigned_int>(this);
  local_50 = Pop<unsigned_int>(this);
  local_54 = Pop<unsigned_int>(this);
  this_02 = RefPtr<wabt::interp::Table>::operator->((RefPtr<wabt::interp::Table> *)local_38);
  local_58 = (Enum)Table::Init(this_02,this->store_,local_54,_src,local_50,dst);
  bVar2 = Failed((Result)local_58);
  if (bVar2) {
    pSVar1 = this->store_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,"out of bounds table access: table.init out of bounds",&local_91)
    ;
    Trap::New(&local_70,pSVar1,&local_90,&this->frames_);
    RefPtr<wabt::interp::Trap>::operator=((RefPtr<wabt::interp::Trap> *)table.root_index_,&local_70)
    ;
    this_local._4_4_ = Trap;
    RefPtr<wabt::interp::Trap>::~RefPtr(&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  else {
    this_local._4_4_ = Ok;
  }
  RefPtr<wabt::interp::Table>::~RefPtr((RefPtr<wabt::interp::Table> *)local_38);
  return this_local._4_4_;
}

Assistant:

RunResult Thread::DoTableInit(Instr instr, Trap::Ptr* out_trap) {
  Table::Ptr table{store_, inst_->tables()[instr.imm_u32x2.fst]};
  auto&& elem = inst_->elems()[instr.imm_u32x2.snd];
  auto size = Pop<u32>();
  auto src = Pop<u32>();
  auto dst = Pop<u32>();
  TRAP_IF(Failed(table->Init(store_, dst, elem, src, size)),
          "out of bounds table access: table.init out of bounds");
  return RunResult::Ok;
}